

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *
gurkenlaeufer::getScenarios_abi_cxx11_(void)

{
  _Atomic_word *__x;
  IParserStatePtr IVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Atomic_word _Var2;
  pointer *__ptr;
  list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *in_RDI;
  bool bVar3;
  Parser local_58;
  __uniq_ptr_impl<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  local_48;
  string local_40;
  
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00197b80;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ScenarioCollection_00197bd0;
  __x = &this[1]._M_use_count;
  this[2]._vptr__Sp_counted_base = (_func_int **)__x;
  *(_Atomic_word **)&this[1]._M_use_count = __x;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  local_48._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       (tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        )operator_new(0x18);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
    bVar3 = __libc_single_threaded == '\0';
    *(undefined ***)
     local_48._M_t.
     super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
     .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
         &PTR__ParserStateFactory_00197638;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)local_48._M_t.
            super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
            .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl + 8) =
         this + 1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)local_48._M_t.
            super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
            .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl + 0x10)
         = this;
    if (bVar3) {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
      goto LAB_0013cd42;
    }
    _Var2 = this->_M_use_count + 1;
  }
  else {
    this->_M_use_count = 2;
    *(undefined ***)
     local_48._M_t.
     super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
     .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
         &PTR__ParserStateFactory_00197638;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)local_48._M_t.
            super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
            .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl + 8) =
         this + 1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)local_48._M_t.
            super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
            .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl + 0x10)
         = this;
    _Var2 = 3;
  }
  this->_M_use_count = _Var2;
LAB_0013cd42:
  Parser::Parser(&local_58,(IParserStateFactoryPtr *)&local_48);
  if ((_Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
       )local_48._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl !=
      (IParserStateFactory *)0x0) {
    (**(code **)(*(long *)local_48._M_t.
                          super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
                          .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>.
                          _M_head_impl + 8))();
  }
  local_48._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       (tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        )(_Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
          )0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addition.feature","");
  Parser::parseFile(&local_58,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (*(*(_func_int ***)
      local_58._currentState._M_t.
      super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
      ._M_t.
      super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
      .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl)[3])();
  IVar1._M_t.
  super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  ._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl =
       (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
        )(__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
          )local_58._currentState;
  local_58._currentState._M_t.
  super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  ._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl =
       (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
        )(__uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
          )0x0;
  if ((_Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>)
      IVar1._M_t.
      super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
      ._M_t.
      super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
      .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl !=
      (_Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>)0x0) {
    (*(*(_func_int ***)
        IVar1._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl)[1])();
  }
  std::__cxx11::list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::list
            (in_RDI,(list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *)__x);
  if ((_Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
       )local_58._currentState._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl !=
      (IParserState *)0x0) {
    (**(code **)(*(long *)local_58._currentState._M_t.
                          super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
                          .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl
                + 8))();
  }
  local_58._currentState._M_t.
  super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  ._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl =
       (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
        )(__uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
          )0x0;
  if ((tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
       )local_58._factory._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl !=
      (_Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_58._factory._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl)[1])();
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return in_RDI;
}

Assistant:

std::list<gurkenlaeufer::Scenario> gurkenlaeufer::getScenarios()
{
    auto scenarios = std::make_shared<gurkenlaeufer::ScenarioCollection>();

    Parser parser(IParserStateFactoryPtr(new gurkenlaeufer::ParserStateFactory(scenarios)));
    parser.parseFile("addition.feature");
    parser.finish();

    return scenarios->getScenarios();
}